

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall
UniformFunction::UniformFunction
          (UniformFunction *this,string *_type,function<void_(vera::Shader_&)> *_assign,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *_print)

{
  (this->print).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->print)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->print).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->print).super__Function_base._M_functor + 8) = 0;
  (this->assign).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->assign)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->assign).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->assign).super__Function_base._M_functor + 8) = 0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  this->present = false;
  std::__cxx11::string::_M_assign((string *)&this->type);
  std::function<void_(vera::Shader_&)>::operator=(&this->assign,_assign);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&this->print,_print);
  return;
}

Assistant:

UniformFunction::UniformFunction(const std::string &_type, std::function<void(vera::Shader&)> _assign, std::function<std::string()> _print) {
    type = _type;
    assign = _assign;
    print = _print;
}